

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  shared_container_t *container;
  long lVar2;
  container_t *c;
  int *c_00;
  int *piVar3;
  ulong uVar4;
  ushort uVar5;
  uint8_t uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint16_t key;
  bool bVar12;
  uint8_t type2;
  uint8_t result_type;
  uint8_t local_52;
  uint8_t local_51;
  uint local_50;
  uint local_4c;
  ulong local_48;
  int *local_40;
  roaring_array_t *local_38;
  
  local_51 = '\0';
  local_50 = (x2->high_low_container).size;
  if (local_50 == 0) {
    return;
  }
  uVar11 = (x1->high_low_container).size;
  uVar4 = (ulong)uVar11;
  if (uVar11 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  uVar5 = *(x1->high_low_container).keys;
  key = *(x2->high_low_container).keys;
  uVar9 = 0;
  uVar7 = 0;
  local_38 = &x2->high_low_container;
LAB_00106ddf:
  do {
    uVar11 = (uint)uVar7;
    uVar9 = (ulong)(int)uVar9;
    uVar10 = (int)uVar4 - 1;
    while( true ) {
      uVar8 = (uint)uVar9;
      if (uVar5 == key) break;
      if (key <= uVar5) {
        local_52 = (x2->high_low_container).typecodes[uVar7 & 0xffff];
        local_48 = uVar4;
        c = get_copy_of_container
                      ((x2->high_low_container).containers[uVar7 & 0xffff],&local_52,
                       (_Bool)((x2->high_low_container).flags & 1));
        if (((x2->high_low_container).flags & 1) != 0) {
          (x2->high_low_container).containers[(int)uVar11] = c;
          (x2->high_low_container).typecodes[(int)uVar11] = local_52;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar8,key,c,local_52);
        uVar11 = uVar11 + 1;
        uVar7 = (ulong)uVar11;
        if (uVar11 != local_50) {
          key = (x2->high_low_container).keys[uVar7 & 0xffff];
        }
        uVar4 = (ulong)((int)local_48 + 1);
        if (uVar11 == local_50) {
LAB_00107021:
          uVar8 = uVar8 + 1;
          goto LAB_00107024;
        }
        uVar9 = uVar9 + 1;
        goto LAB_00106ddf;
      }
      if (uVar10 == uVar8) goto LAB_00107021;
      uVar9 = uVar9 + 1;
      uVar5 = (x1->high_low_container).keys[uVar9 & 0xffff];
    }
    uVar6 = (x1->high_low_container).typecodes[uVar9 & 0xffff];
    container = (shared_container_t *)(x1->high_low_container).containers[uVar9 & 0xffff];
    local_52 = (x2->high_low_container).typecodes[uVar7 & 0xffff];
    local_4c = uVar11;
    if (uVar6 == '\x04') {
      local_48 = uVar4;
      local_40 = (int *)container_xor(container,'\x04',
                                      (x2->high_low_container).containers[uVar7 & 0xffff],local_52,
                                      &local_51);
      shared_container_free(container);
      c_00 = local_40;
    }
    else {
      local_48 = uVar4;
      c_00 = (int *)container_ixor(container,uVar6,
                                   (x2->high_low_container).containers[uVar7 & 0xffff],local_52,
                                   &local_51);
    }
    x2 = (roaring_bitmap_t *)local_38;
    piVar3 = c_00;
    uVar6 = local_51;
    if (local_51 == '\x04') {
      uVar6 = (uint8_t)c_00[2];
      piVar3 = *(int **)c_00;
    }
    iVar1 = *piVar3;
    if ((uVar6 == '\x03') || (uVar6 == '\x02')) {
      bVar12 = 0 < iVar1;
    }
    else {
      if (iVar1 == -1) {
        if (**(long **)(piVar3 + 2) == 0) {
          uVar4 = 0xffffffffffffffff;
          do {
            if (uVar4 == 0x3fe) {
              uVar7 = 0x3ff;
              break;
            }
            uVar7 = uVar4 + 1;
            lVar2 = uVar4 + 2;
            uVar4 = uVar7;
          } while ((*(long **)(piVar3 + 2))[lVar2] == 0);
          bVar12 = 0x3fe < uVar7;
        }
        else {
          bVar12 = false;
        }
      }
      else {
        bVar12 = iVar1 == 0;
      }
      bVar12 = (bool)(bVar12 ^ 1);
    }
    if (bVar12) {
      (x1->high_low_container).containers[uVar9] = c_00;
      (x1->high_low_container).typecodes[uVar9] = local_51;
      uVar9 = (ulong)(uVar8 + 1);
      uVar4 = local_48;
    }
    else {
      container_free(c_00,local_51);
      ra_remove_at_index(&x1->high_low_container,uVar8);
      uVar4 = (ulong)uVar10;
    }
    uVar11 = local_4c + 1;
    uVar7 = (ulong)uVar11;
    uVar8 = (uint)uVar9;
    if (uVar11 == local_50 || uVar8 == (uint)uVar4) {
LAB_00107024:
      if (uVar8 != (uint)uVar4) {
        return;
      }
      ra_append_copy_range
                (&x1->high_low_container,&x2->high_low_container,uVar11,local_50,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    uVar5 = (x1->high_low_container).keys[uVar8 & 0xffff];
    key = (x2->high_low_container).keys[uVar11 & 0xffff];
  } while( true );
}

Assistant:

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }

    // XOR can have new containers inserted from x2, but can also
    // lose containers when x1 and x2 are nonempty and identical.

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // so release
            } else {
                c = container_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }

            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}